

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_rb_available_read(ma_rb *pRB)

{
  ma_int32 dist;
  ma_rb *pRB_local;
  
  if (pRB == (ma_rb *)0x0) {
    pRB_local._4_4_ = 0;
  }
  else {
    pRB_local._4_4_ = ma_rb_pointer_distance(pRB);
    if ((int)pRB_local._4_4_ < 0) {
      pRB_local._4_4_ = 0;
    }
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_uint32 ma_rb_available_read(ma_rb* pRB)
{
    ma_int32 dist;

    if (pRB == NULL) {
        return 0;
    }

    dist = ma_rb_pointer_distance(pRB);
    if (dist < 0) {
        return 0;
    }

    return dist;
}